

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHullComputer.cpp
# Opt level: O0

int getVertexCopy(Vertex *vertex,btAlignedObjectArray<btConvexHullInternal::Vertex_*> *vertices)

{
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> *in_RSI;
  Vertex **in_RDI;
  int index;
  btAlignedObjectArray<btConvexHullInternal::Vertex_*> *unaff_retaddr;
  int local_14;
  
  local_14 = *(int *)(in_RDI + 0xf);
  if (local_14 < 0) {
    local_14 = btAlignedObjectArray<btConvexHullInternal::Vertex_*>::size(in_RSI);
    *(int *)(in_RDI + 0xf) = local_14;
    btAlignedObjectArray<btConvexHullInternal::Vertex_*>::push_back(unaff_retaddr,in_RDI);
  }
  return local_14;
}

Assistant:

static int getVertexCopy(btConvexHullInternal::Vertex* vertex, btAlignedObjectArray<btConvexHullInternal::Vertex*>& vertices)
{
	int index = vertex->copy;
	if (index < 0)
	{
		index = vertices.size();
		vertex->copy = index;
		vertices.push_back(vertex);
#ifdef DEBUG_CONVEX_HULL
		printf("Vertex %d gets index *%d\n", vertex->point.index, index);
#endif
	}
	return index;
}